

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::internal::UnitTestImpl::ShouldWarnIfNoTestsMatchFilter(UnitTestImpl *this)

{
  bool bVar1;
  int iVar2;
  const_iterator this_00;
  const_iterator test_suite_name_00;
  reference ppTVar3;
  string *test_name;
  TestInfo *test_info;
  iterator __end3;
  iterator __begin3;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *__range3;
  string *test_suite_name;
  TestSuite *test_suite;
  const_iterator __end2;
  const_iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  PositiveAndNegativeUnitTestFilter gtest_flag_filter;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  __normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
  local_f8 [3];
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *local_e0;
  string *local_d8;
  TestSuite *this_01;
  bool local_1;
  
  iVar2 = total_test_count((UnitTestImpl *)
                           CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  if (iVar2 == 0) {
    local_1 = false;
  }
  else {
    anon_unknown_37::PositiveAndNegativeUnitTestFilter::PositiveAndNegativeUnitTestFilter
              ((PositiveAndNegativeUnitTestFilter *)
               gtest_flag_filter.positive_filter_.exact_match_patterns_._M_h._M_before_begin._M_nxt,
               (string *)
               gtest_flag_filter.positive_filter_.exact_match_patterns_._M_h._M_bucket_count);
    this_00 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                        ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                         in_stack_fffffffffffffec8);
    test_suite_name_00 =
         std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                   ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                    in_stack_fffffffffffffec8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                          *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                         (__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                          *)in_stack_fffffffffffffec8);
      if (!bVar1) break;
      ppTVar3 = __gnu_cxx::
                __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                ::operator*((__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                             *)&stack0xffffffffffffff40);
      this_01 = *ppTVar3;
      local_d8 = &this_01->name_;
      local_e0 = TestSuite::test_info_list(this_01);
      local_f8[0]._M_current =
           (TestInfo **)
           std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::begin
                     (in_stack_fffffffffffffec8);
      std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::end
                (in_stack_fffffffffffffec8);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
                            *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                           (__normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
                            *)in_stack_fffffffffffffec8);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
        ::operator*(local_f8);
        in_stack_fffffffffffffed7 =
             anon_unknown_37::PositiveAndNegativeUnitTestFilter::MatchesTest
                       ((PositiveAndNegativeUnitTestFilter *)this_00._M_current,
                        (string *)test_suite_name_00._M_current,(string *)this_01);
        if ((bool)in_stack_fffffffffffffed7) {
          local_1 = false;
          goto LAB_001feabf;
        }
        __gnu_cxx::
        __normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
        ::operator++(local_f8);
      }
      __gnu_cxx::
      __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
      ::operator++((__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                    *)&stack0xffffffffffffff40);
    }
    local_1 = true;
LAB_001feabf:
    anon_unknown_37::PositiveAndNegativeUnitTestFilter::~PositiveAndNegativeUnitTestFilter
              ((PositiveAndNegativeUnitTestFilter *)
               CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  }
  return local_1;
}

Assistant:

bool UnitTestImpl::ShouldWarnIfNoTestsMatchFilter() const {
  if (total_test_count() == 0) {
    // No tests were linked in to program.
    // This case is handled by a different warning.
    return false;
  }
  const PositiveAndNegativeUnitTestFilter gtest_flag_filter(
      GTEST_FLAG_GET(filter));
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name_;
    for (TestInfo* test_info : test_suite->test_info_list()) {
      const std::string& test_name = test_info->name_;
      if (gtest_flag_filter.MatchesTest(test_suite_name, test_name)) {
        return false;
      }
    }
  }
  return true;
}